

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_lpf2_init_preallocated(ma_lpf2_config *pConfig,void *pHeap,ma_lpf2 *pLPF)

{
  double dVar1;
  ma_result mVar2;
  double __x;
  double dVar3;
  ma_biquad_config bqConfig;
  ma_biquad_config local_50;
  
  mVar2 = MA_INVALID_ARGS;
  if (pLPF != (ma_lpf2 *)0x0) {
    (pLPF->bq)._pHeap = (void *)0x0;
    *(undefined8 *)&(pLPF->bq)._ownsHeap = 0;
    (pLPF->bq).pR1 = (ma_biquad_coefficient *)0x0;
    (pLPF->bq).pR2 = (ma_biquad_coefficient *)0x0;
    (pLPF->bq).b2 = (ma_biquad_coefficient)0x0;
    (pLPF->bq).a1 = (ma_biquad_coefficient)0x0;
    *(undefined8 *)&(pLPF->bq).a2 = 0;
    (pLPF->bq).format = ma_format_unknown;
    (pLPF->bq).channels = 0;
    (pLPF->bq).b0 = (ma_biquad_coefficient)0x0;
    (pLPF->bq).b1 = (ma_biquad_coefficient)0x0;
    if (pConfig != (ma_lpf2_config *)0x0) {
      dVar1 = pConfig->q;
      __x = (pConfig->cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
      dVar3 = sin(__x);
      local_50.a1 = sin(1.5707963267948966 - __x);
      dVar3 = dVar3 / (dVar1 + dVar1);
      local_50.b1 = 1.0 - local_50.a1;
      local_50.b0 = local_50.b1 * 0.5;
      local_50.a0 = dVar3 + 1.0;
      local_50.a1 = local_50.a1 * -2.0;
      local_50.a2 = 1.0 - dVar3;
      local_50.format = pConfig->format;
      local_50.channels = pConfig->channels;
      local_50.b2 = local_50.b0;
      mVar2 = ma_biquad_init_preallocated(&local_50,pHeap,&pLPF->bq);
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_lpf2_init_preallocated(const ma_lpf2_config* pConfig, void* pHeap, ma_lpf2* pLPF)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pLPF == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pLPF);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_lpf2__get_biquad_config(pConfig);
    result = ma_biquad_init_preallocated(&bqConfig, pHeap, &pLPF->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}